

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

bool __thiscall
CAPSFile::GetStreamGapItem
          (CAPSFile *this,StreamItem *item,uchar *buffer,uint *offset,uint size_of_buffer)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = *offset;
  *offset = uVar6 + 1;
  bVar5 = buffer[uVar6];
  if (bVar5 == 0) {
    return false;
  }
  item->size = 0;
  item->sample_size = '\0';
  item->sample = '\0';
  *(undefined2 *)&item->field_0x6 = 0;
  do {
    bVar2 = size_of_buffer <= *offset || bVar5 == 0;
    if (bVar2) {
      return bVar2;
    }
    uVar6 = 0;
    if (0x1f < bVar5) {
      uVar4 = *offset;
      iVar3 = (uint)(bVar5 >> 5) * 8 + -8;
      uVar6 = 0;
      do {
        uVar7 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *offset = uVar4;
        uVar6 = uVar6 + ((uint)buffer[uVar7] << ((byte)iVar3 & 0x1f));
        iVar3 = iVar3 + -8;
      } while (iVar3 != -8);
    }
    if ((bVar5 & 0x1f) == 1) {
      item->size = uVar6;
LAB_0012d5b4:
      uVar6 = *offset;
      *offset = uVar6 + 1;
      bVar5 = buffer[uVar6];
      bVar1 = true;
    }
    else {
      if ((bVar5 & 0x1f) == 2) {
        uVar4 = *offset;
        *offset = uVar4 + 1;
        item->sample = buffer[uVar4];
        item->sample_size = (uchar)uVar6;
        goto LAB_0012d5b4;
      }
      bVar1 = false;
    }
    if (!bVar1) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool CAPSFile::GetStreamGapItem(CAPSFile::StreamItem* item, unsigned char* buffer, unsigned int& offset,
                                unsigned int size_of_buffer)
{
   // Next stream item
   unsigned char b = buffer[offset++];

   if (b == 0) return false;

   memset(item, 0, sizeof(StreamItem));
   while (b != 0 && offset < size_of_buffer)
   {
      int size = b >> 5;
      int type = b & 0x1F;
      int gap_size = 0;
      for (int j = 0; j < size; j++)
      {
         gap_size += (buffer[offset++] << (8 * (size - (j + 1))));
      }

      if (type == 1)
      {
         item->size = gap_size;
      }
      else if (type == 2)
      {
         item->sample = buffer[offset++];
         item->sample_size = gap_size;
      }
      else return false;

      b = buffer[offset++];
   }
   return true;
}